

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

void __thiscall
absl::str_format_internal::anon_unknown_0::FormatANormalize<absl::uint128>
          (anon_unknown_0 *this,HexFloatTypeParams float_traits,uint8_t *leading,uint128 *mantissa,
          int *exp)

{
  uint128 lhs;
  bool bVar1;
  uchar uVar2;
  uint128 val;
  uint128 lhs_00;
  int local_c0;
  bool local_b9;
  uint128 local_b8;
  uint64_t local_a8;
  uint64_t local_a0;
  absl *local_98;
  undefined8 local_90;
  uint128 local_88;
  uint64_t local_78;
  uint64_t local_70;
  undefined8 local_68;
  undefined8 local_60;
  uint128 local_58;
  undefined8 local_40;
  size_t kLeadDigitBitsCount;
  size_t kIntBits;
  int *exp_local;
  uint128 *mantissa_local;
  uint8_t *leading_local;
  HexFloatTypeParams float_traits_local;
  
  mantissa_local = (uint128 *)float_traits.leading_digit_size_bits;
  local_40 = float_traits._0_8_;
  leading_local._0_4_ = (int)this;
  kLeadDigitBitsCount = 0x80;
  kIntBits = (size_t)mantissa;
  exp_local = (int *)leading;
  float_traits_local._0_8_ = local_40;
  while( true ) {
    bVar1 = uint128::operator_cast_to_bool((uint128 *)exp_local);
    local_b9 = false;
    if (bVar1) {
      local_68 = *(undefined8 *)exp_local;
      local_60 = *(undefined8 *)(exp_local + 2);
      local_78 = 0;
      local_70 = 0x8000000000000000;
      local_58 = operator&(*(uint128 *)exp_local,(uint128)(ZEXT816(0x8000000000000000) << 0x40));
      val.hi_ = local_58.hi_;
      val.lo_ = val.hi_;
      local_b9 = operator!((absl *)local_58.lo_,val);
    }
    if (local_b9 == false) break;
    if (*(int *)kIntBits + -1 < (int)leading_local) {
      uint128::operator>>=((uint128 *)exp_local,(int)leading_local - *(int *)kIntBits);
      *(int *)kIntBits = (int)leading_local;
      return;
    }
    uint128::operator<<=((uint128 *)exp_local,1);
    *(int *)kIntBits = *(int *)kIntBits + -1;
  }
  local_98 = *(absl **)exp_local;
  local_90 = *(undefined8 *)(exp_local + 2);
  lhs_00.hi_._0_4_ = 0x80 - (int)local_40;
  lhs_00.lo_ = local_90;
  lhs_00.hi_._4_4_ = 0;
  local_88 = operator>>(local_98,lhs_00,(int)local_98);
  uVar2 = uint128::operator_cast_to_unsigned_char(&local_88);
  *(uchar *)&mantissa_local->lo_ = uVar2;
  local_a8 = *(uint64_t *)exp_local;
  local_a0 = *(uint64_t *)(exp_local + 2);
  uint128::uint128(&local_b8,0);
  lhs.hi_ = local_a0;
  lhs.lo_ = local_a8;
  bVar1 = absl::operator!=(lhs,local_b8);
  local_c0 = (int)local_40;
  if (!bVar1) {
    local_c0 = *(int *)kIntBits;
  }
  *(int *)kIntBits = *(int *)kIntBits - local_c0;
  uint128::operator<<=((uint128 *)exp_local,(int)local_40);
  return;
}

Assistant:

void FormatANormalize(const HexFloatTypeParams float_traits, uint8_t *leading,
                      Int *mantissa, int *exp) {
  constexpr size_t kIntBits = sizeof(Int) * 8;
  static const Int kHighIntBit = Int{1} << (kIntBits - 1);
  const size_t kLeadDigitBitsCount = float_traits.leading_digit_size_bits;
  // Normalize mantissa so that highest bit set is in MSB position, unless we
  // get interrupted by the exponent threshold.
  while (*mantissa && !(*mantissa & kHighIntBit)) {
    if (ABSL_PREDICT_FALSE(*exp - 1 < float_traits.min_exponent)) {
      *mantissa >>= (float_traits.min_exponent - *exp);
      *exp = float_traits.min_exponent;
      return;
    }
    *mantissa <<= 1;
    --*exp;
  }
  // Extract bits for leading digit then shift them away leaving the
  // fractional part.
  *leading = static_cast<uint8_t>(
      *mantissa >> static_cast<int>(kIntBits - kLeadDigitBitsCount));
  *exp -= (*mantissa != 0) ? static_cast<int>(kLeadDigitBitsCount) : *exp;
  *mantissa <<= static_cast<int>(kLeadDigitBitsCount);
}